

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O3

float64 float64_sqrt(float64 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  float64 fVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  bits32 aLow;
  ulong uVar13;
  bits64 zSig;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  
  uVar3 = a & 0xfffffffffffff;
  uVar14 = (uint)(a >> 0x34);
  uVar8 = uVar14 & 0x7ff;
  if (uVar8 == 0x7ff) {
    if (uVar3 != 0) {
      fVar4 = propagateFloat64NaN(a,a);
      return fVar4;
    }
    if (-1 < (long)a) {
      return a;
    }
LAB_00467bb0:
    float_exception_flags = float_exception_flags | 1;
    return 0xffffffffffffffff;
  }
  if ((long)a < 0) {
    if ((uVar14 & 0x7ff) == 0 && uVar3 == 0) {
      return a;
    }
    goto LAB_00467bb0;
  }
  if ((short)uVar8 == 0) {
    if (uVar3 == 0) {
      return 0;
    }
    uVar13 = uVar3 >> 0x20;
    uVar5 = uVar13;
    if (uVar13 == 0) {
      uVar5 = uVar3;
    }
    uVar8 = (uint)uVar5 << 0x10;
    if (uVar5 >= 0x10000) {
      uVar8 = (uint)uVar5;
    }
    bVar12 = (uVar5 < 0x10000) * '\x10';
    bVar7 = bVar12 + 8;
    uVar14 = uVar8 << 8;
    if (0xffffff < uVar8) {
      bVar7 = bVar12;
      uVar14 = uVar8;
    }
    bVar7 = (((uVar13 == 0) << 5 | bVar7) +
            countLeadingZeros32_countLeadingZerosHigh[uVar14 >> 0x18]) - 0xb;
    uVar3 = uVar3 << (bVar7 & 0x3f);
    uVar8 = 1 - (int)(char)bVar7;
  }
  uVar13 = (uVar3 | 0x10000000000000) >> 0x15;
  uVar5 = (ulong)((ushort)(uVar3 >> 0x30) & 0xf);
  uVar14 = (uint)uVar13;
  uVar16 = ((uint)(uVar3 >> 0x20) & 0x1fffc0 | 0x100000) >> 6;
  if ((uVar8 & 1) == 0) {
    uVar15 = (uVar16 | 0x8000) - (uint)*(ushort *)(estimateSqrt32_sqrtEvenAdjustments + uVar5 * 2);
    uVar15 = (int)(((uVar3 & 0x1fffffffe00000 | 0x10000000000000) >> 0x15) / (ulong)uVar15) + uVar15
    ;
    uVar16 = 0xffff8000;
    if (uVar15 < 0x20000) {
      uVar16 = uVar15 * 0x8000;
    }
    if (uVar16 <= uVar14) {
      uVar14 = (int)uVar14 >> 1;
      goto LAB_00467bfe;
    }
  }
  else {
    uVar16 = (uVar16 - *(ushort *)(estimateSqrt32_sqrtOddAdjustments + uVar5 * 2)) + 0x4000;
    uVar16 = uVar16 * 0x8000 +
             (int)(((uVar3 & 0x1fffffffe00000 | 0x10000000000000) >> 0x15) / (ulong)uVar16) * 0x4000
    ;
    uVar13 = (ulong)(uVar14 >> 1);
  }
  uVar14 = (uVar16 >> 1) + (int)(((uVar13 & 0xffffffff) << 0x1f) / (ulong)uVar16);
LAB_00467bfe:
  uVar3 = (uVar3 | 0x10000000000000) << ((byte)uVar8 & 1 ^ 9);
  uVar5 = CONCAT44(0,uVar14);
  if (uVar3 < uVar5 << 0x20) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar13 = SUB168(auVar2 / auVar1,0) << 0x20;
    for (lVar9 = uVar3 - SUB164(auVar2 / auVar1,0) * uVar5; lVar9 < 0; lVar9 = lVar9 + uVar5) {
      uVar13 = uVar13 - 0x100000000;
    }
    uVar6 = 0xffffffff;
    if ((ulong)(lVar9 << 0x20) < uVar5 << 0x20) {
      uVar6 = (ulong)(lVar9 << 0x20) / uVar5;
    }
    zSig = uVar5 * 0x40000000 + (uVar6 | uVar13);
    if (((uint)uVar6 & 0x1fe) < 6) {
      uVar17 = zSig >> 0x20;
      uVar18 = (zSig & 0xffffffff) * uVar17;
      uVar10 = uVar18 >> 0x1f;
      uVar19 = zSig * zSig;
      uVar11 = -uVar19;
      lVar9 = ((uVar3 - (uVar19 != 0)) -
              ((uVar10 & 0xffffffff) + uVar17 * uVar17 + (uVar10 & 0x100000000))) -
              (ulong)(uVar19 < uVar18 << 0x21);
      if (lVar9 < 0) {
        uVar3 = (uVar5 * 0x80000000 + (uVar6 | uVar13) * 2) - 1;
        do {
          zSig = zSig - 1;
          bVar20 = CARRY8(uVar11,uVar3);
          uVar11 = uVar11 + uVar3;
          lVar9 = (lVar9 - ((long)zSig >> 0x3f)) + (ulong)bVar20;
          uVar3 = uVar3 - 2;
        } while (lVar9 < 0);
      }
      zSig = zSig | (lVar9 != 0 || uVar11 != 0);
    }
  }
  else {
    zSig = uVar5 * 0x40000000 - 1;
  }
  fVar4 = roundAndPackFloat64('\0',(short)((int)(short)uVar8 + 0x1fc01U >> 1) + 0x3fe,zSig);
  return fVar4;
}

Assistant:

float64 float64_sqrt( float64 a )
{
	flag aSign;
	int16 aExp, zExp;
	bits64 aSig, zSig, doubleZSig;
	bits64 rem0, rem1, term0, term1;
//    float64 z;

	aSig = extractFloat64Frac( a );
	aExp = extractFloat64Exp( a );
	aSign = extractFloat64Sign( a );
	if ( aExp == 0x7FF ) {
		if ( aSig ) return propagateFloat64NaN( a, a );
		if ( ! aSign ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aSign ) {
		if ( ( aExp | aSig ) == 0 ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return 0;
		normalizeFloat64Subnormal( aSig, &aExp, &aSig );
	}
	zExp = ( ( aExp - 0x3FF )>>1 ) + 0x3FE;
	aSig |= LIT64( 0x0010000000000000 );
	zSig = estimateSqrt32( aExp, aSig>>21 );
	aSig <<= 9 - ( aExp & 1 );
	zSig = estimateDiv128To64( aSig, 0, zSig<<32 ) + ( zSig<<30 );
	if ( ( zSig & 0x1FF ) <= 5 ) {
		doubleZSig = zSig<<1;
		mul64To128( zSig, zSig, &term0, &term1 );
		sub128( aSig, 0, term0, term1, &rem0, &rem1 );
		while ( (sbits64) rem0 < 0 ) {
			--zSig;
			doubleZSig -= 2;
			add128( rem0, rem1, zSig>>63, doubleZSig | 1, &rem0, &rem1 );
		}
		zSig |= ( ( rem0 | rem1 ) != 0 );
	}
	return roundAndPackFloat64( 0, zExp, zSig );

}